

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall
MeasurementToString_unitWithNumbers_Test::MeasurementToString_unitWithNumbers_Test
          (MeasurementToString_unitWithNumbers_Test *this)

{
  MeasurementToString_unitWithNumbers_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MeasurementToString_unitWithNumbers_Test_00217328;
  return;
}

Assistant:

TEST(MeasurementToString, unitWithNumbers)
{
    measurement ounit = 10.0 * unit(0.712412, kg.pow(2));
    precise_measurement ounitp =
        10.0 * precise_unit(0.712412, precise::kg.pow(2));
    auto str1 = to_string(ounit);
    auto str2 = to_string(ounitp);
    EXPECT_EQ(str1.compare(0, 11, "10 (0.71241"), 0);
    EXPECT_EQ(str2.compare(0, 11, "10 (0.71241"), 0);
}